

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

float32 helper_recpsf_f32_aarch64(float32 a,float32 b,void *fpstp)

{
  float32 fVar1;
  float32 a_00;
  int iVar2;
  float_status *fpst;
  void *fpstp_local;
  float32 b_local;
  float32 a_local;
  
  fVar1 = float32_squash_input_denormal_aarch64(a,(float_status *)fpstp);
  a_00 = float32_squash_input_denormal_aarch64(b,(float_status *)fpstp);
  fVar1 = float32_chs(fVar1);
  iVar2 = float32_is_infinity(fVar1);
  if (iVar2 == 0) {
LAB_006f681d:
    iVar2 = float32_is_infinity(a_00);
    if (iVar2 != 0) {
      iVar2 = float32_is_zero(fVar1);
      if (iVar2 != 0) goto LAB_006f6837;
    }
    b_local = float32_muladd_aarch64(fVar1,a_00,0x40000000,0,(float_status *)fpstp);
  }
  else {
    iVar2 = float32_is_zero(a_00);
    if (iVar2 == 0) goto LAB_006f681d;
LAB_006f6837:
    b_local = 0x40000000;
  }
  return b_local;
}

Assistant:

float32 HELPER(recpsf_f32)(float32 a, float32 b, void *fpstp)
{
    float_status *fpst = fpstp;

    a = float32_squash_input_denormal(a, fpst);
    b = float32_squash_input_denormal(b, fpst);

    a = float32_chs(a);
    if ((float32_is_infinity(a) && float32_is_zero(b)) ||
        (float32_is_infinity(b) && float32_is_zero(a))) {
        return float32_two;
    }
    return float32_muladd(a, b, float32_two, 0, fpst);
}